

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::Configure(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCacheManager *this_00;
  cmState *this_01;
  int iVar2;
  char *__s;
  size_t sVar3;
  string local_48;
  
  if (this->DoSuppressDevWarnings == true) {
    this_00 = this->CacheManager;
    if (this->SuppressDevWarnings == true) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
      cmCacheManager::AddCacheEntry
                (this_00,&local_48,"TRUE",
                 "Suppress Warnings that are meant for the author of the CMakeLists.txt files.",
                 INTERNAL);
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
      cmCacheManager::AddCacheEntry
                (this_00,&local_48,"FALSE",
                 "Suppress Warnings that are meant for the author of the CMakeLists.txt files.",
                 INTERNAL);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2 = ActualConfigure(this);
  this_01 = this->State;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
  __s = cmState::GetGlobalProperty(this_01,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    local_48._M_dataplus._M_p = (pointer)paVar1;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,__s + sVar3);
    iVar2 = HandleDeleteCacheVariables(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar2;
}

Assistant:

int cmake::Configure()
{
  if(this->DoSuppressDevWarnings)
    {
    if(this->SuppressDevWarnings)
      {
      this->CacheManager->
        AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "TRUE",
                      "Suppress Warnings that are meant for"
                      " the author of the CMakeLists.txt files.",
                      cmState::INTERNAL);
      }
    else
      {
      this->CacheManager->
        AddCacheEntry("CMAKE_SUPPRESS_DEVELOPER_WARNINGS", "FALSE",
                      "Suppress Warnings that are meant for"
                      " the author of the CMakeLists.txt files.",
                      cmState::INTERNAL);
      }
    }
  int ret = this->ActualConfigure();
  const char* delCacheVars = this->State
                    ->GetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_");
  if(delCacheVars && delCacheVars[0] != 0)
    {
    return this->HandleDeleteCacheVariables(delCacheVars);
    }
  return ret;

}